

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O3

void __thiscall
amrex::BaseFab<double>::BaseFab
          (BaseFab<double> *this,BaseFab<double> *rhs,MakeType make_type,int scomp,int ncomp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Arena *pAVar4;
  double *pdVar5;
  
  pAVar4 = DataAllocator::arena(&rhs->super_DataAllocator);
  (this->super_DataAllocator).m_arena = pAVar4;
  this->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  pdVar5 = dataPtr(rhs,scomp);
  this->dptr = pdVar5;
  uVar1 = *(undefined8 *)((rhs->domain).smallend.vect + 2);
  uVar2 = *(undefined8 *)(rhs->domain).bigend.vect;
  uVar3 = *(undefined8 *)((rhs->domain).bigend.vect + 2);
  *(undefined8 *)(this->domain).smallend.vect = *(undefined8 *)(rhs->domain).smallend.vect;
  *(undefined8 *)((this->domain).smallend.vect + 2) = uVar1;
  *(undefined8 *)(this->domain).bigend.vect = uVar2;
  *(undefined8 *)((this->domain).bigend.vect + 2) = uVar3;
  this->nvar = ncomp;
  this->truesize =
       (long)(((rhs->domain).bigend.vect[2] - (rhs->domain).smallend.vect[2]) + 1) *
       (long)(((rhs->domain).bigend.vect[1] - (rhs->domain).smallend.vect[1]) + 1) *
       (long)(((rhs->domain).bigend.vect[0] - (rhs->domain).smallend.vect[0]) + 1) * (long)ncomp;
  this->ptr_owner = false;
  this->shared_memory = false;
  if (make_type != make_alias) {
    if (make_type != make_deep_copy) {
      Abort_host("BaseFab: unknown MakeType");
      return;
    }
    this->dptr = (double *)0x0;
    define(this);
    copy<(amrex::RunOn)0>(this,rhs,&this->domain,scomp,&this->domain,0,ncomp);
  }
  return;
}

Assistant:

BaseFab<T>::BaseFab (const BaseFab<T>& rhs, MakeType make_type, int scomp, int ncomp)
    : DataAllocator{rhs.arena()},
      dptr(const_cast<T*>(rhs.dataPtr(scomp))),
      domain(rhs.domain), nvar(ncomp),
      truesize(ncomp*rhs.domain.numPts())
{
    AMREX_ASSERT(scomp+ncomp <= rhs.nComp());
    if (make_type == amrex::make_deep_copy)
    {
        this->dptr = nullptr;
        define();
        this->copy<RunOn::Device>(rhs, this->domain, scomp, this->domain, 0, ncomp);
    } else if (make_type == amrex::make_alias) {
        ; // nothing to do
    } else {
        amrex::Abort("BaseFab: unknown MakeType");
    }
}